

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono.h
# Opt level: O3

void __thiscall
fmt::v5::internal::
chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
::on_iso_time(chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
              *this)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *pbVar1;
  long lVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  ulong uVar5;
  
  on_24_hour_time(this);
  pbVar1 = (this->out).container;
  sVar4 = (pbVar1->super_basic_buffer<char>).size_;
  uVar5 = sVar4 + 1;
  if ((pbVar1->super_basic_buffer<char>).capacity_ < uVar5) {
    (**(pbVar1->super_basic_buffer<char>)._vptr_basic_buffer)(pbVar1);
    sVar4 = (pbVar1->super_basic_buffer<char>).size_;
    uVar5 = sVar4 + 1;
  }
  (pbVar1->super_basic_buffer<char>).size_ = uVar5;
  (pbVar1->super_basic_buffer<char>).ptr_[sVar4] = ':';
  lVar2 = (this->s).__r;
  auVar3 = SEXT816(lVar2) * ZEXT816(0x8888888888888889);
  write(this,(int)lVar2 + ((int)(auVar3._8_8_ >> 5) - (auVar3._12_4_ >> 0x1f)) * -0x3c,(void *)0x2,
        0x8888888888888889);
  return;
}

Assistant:

void on_iso_time() {
    on_24_hour_time();
    *out++ = ':';
    write(second(), 2);
  }